

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O3

void __thiscall
MockSupport::setMockFailureStandardReporter(MockSupport *this,MockFailureReporter *reporter)

{
  MockSupport *pMVar1;
  MockSupport *pMVar2;
  MockFailureReporter *pMVar3;
  MockSupport *node;
  
  pMVar3 = &this->defaultReporter_;
  if (reporter != (MockFailureReporter *)0x0) {
    pMVar3 = reporter;
  }
  this->standardReporter_ = pMVar3;
  if (this->lastActualFunctionCall_ != (MockCheckedActualCall *)0x0) {
    (*(this->lastActualFunctionCall_->super_MockActualCall)._vptr_MockActualCall[0x32])();
  }
  pMVar2 = (MockSupport *)&this->data_;
  pMVar1 = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar2);
  while (node = pMVar1, node != (MockSupport *)0x0) {
    pMVar1 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
    if (pMVar1 != (MockSupport *)0x0) {
      pMVar2 = getMockSupport(pMVar2,(MockNamedValueListNode *)node);
      (*pMVar2->_vptr_MockSupport[0x29])(pMVar2,this->standardReporter_);
    }
    pMVar1 = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
    pMVar2 = node;
  }
  return;
}

Assistant:

void MockSupport::setMockFailureStandardReporter(MockFailureReporter* reporter)
{
    standardReporter_ = (reporter != NULLPTR) ? reporter : &defaultReporter_;

    if (lastActualFunctionCall_)
        lastActualFunctionCall_->setMockFailureReporter(standardReporter_);

    for (MockNamedValueListNode* p = data_.begin(); p; p = p->next())
        if (getMockSupport(p)) getMockSupport(p)->setMockFailureStandardReporter(standardReporter_);
}